

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O1

void FT_Stream_ReleaseFrame(FT_Stream stream,FT_Byte **pbytes)

{
  if ((stream != (FT_Stream)0x0) && (stream->read != (FT_Stream_IoFunc)0x0)) {
    if (*pbytes != (FT_Byte *)0x0) {
      (*stream->memory->free)(stream->memory,*pbytes);
    }
    *pbytes = (FT_Byte *)0x0;
  }
  *pbytes = (FT_Byte *)0x0;
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Stream_ReleaseFrame( FT_Stream  stream,
                          FT_Byte**  pbytes )
  {
    if ( stream && stream->read )
    {
      FT_Memory  memory = stream->memory;

#ifdef FT_DEBUG_MEMORY
      ft_mem_free( memory, *pbytes );
      *pbytes = NULL;
#else
      FT_FREE( *pbytes );
#endif
    }
    *pbytes = NULL;
  }